

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

Function * __thiscall
dg::llvmdg::legacy::GraphBuilder::buildFunction
          (GraphBuilder *this,Function *llvmFunction,bool recursively)

{
  _Rb_tree_header *p_Var1;
  unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
  *this_00;
  iterator iVar2;
  long lVar3;
  bool bVar4;
  Function *this_01;
  int iVar5;
  uint uVar6;
  int iVar7;
  Block *pBVar8;
  Block *pBVar9;
  vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>> *pvVar10;
  mapped_type *ppBVar11;
  long lVar12;
  Block *successor;
  long extraout_RAX;
  Block *successor_00;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  undefined7 in_register_00000011;
  _Base_ptr p_Var15;
  Function *pFVar16;
  BasicBlock *pBVar17;
  int __status;
  Function *pFVar18;
  BasicBlock *__range3;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_bool>
  pVar19;
  bool createBlock;
  bool createCallReturn;
  Block *lastBlock;
  TarjanAnalysis<dg::llvmdg::legacy::Block> tarjan;
  map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  instToBlockMap;
  bool local_18a;
  bool local_189;
  Block *local_188;
  GraphBuilder *local_180;
  Function *local_178;
  Function *local_170;
  Function *local_168;
  Function *local_160;
  Function *local_158;
  undefined1 local_150 [192];
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_90;
  _Rb_tree<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>,_std::_Select1st<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  local_60;
  
  local_170 = (Function *)CONCAT44(local_170._4_4_,(int)CONCAT71(in_register_00000011,recursively));
  if (llvmFunction != (Function *)0x0) {
    p_Var1 = &(this->_functions)._M_t._M_impl.super__Rb_tree_header;
    p_Var15 = (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var14 = &p_Var1->_M_header;
    for (; p_Var15 != (_Base_ptr)0x0;
        p_Var15 = (&p_Var15->_M_left)[*(Function **)(p_Var15 + 1) < llvmFunction]) {
      if (*(Function **)(p_Var15 + 1) >= llvmFunction) {
        p_Var14 = p_Var15;
      }
    }
    p_Var15 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
       (p_Var15 = p_Var14, llvmFunction < *(Function **)(p_Var14 + 1))) {
      p_Var15 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var15 == p_Var1) {
      local_180 = this;
      local_168 = llvmFunction;
      pBVar8 = (Block *)operator_new(0x40);
      Function::Function((Function *)pBVar8);
      local_150._0_8_ = pBVar8;
      pVar19 = std::
               _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
               ::_M_emplace_unique<llvm::Function_const*&,dg::llvmdg::legacy::Function*>
                         ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
                           *)&this->_functions,&local_168,(Function **)local_150);
      local_178 = (Function *)pVar19.first._M_node._M_node[1]._M_parent;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_188 = (Block *)0x0;
      pFVar16 = *(Function **)(local_168 + 0x50);
      local_160 = local_168 + 0x48;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pFVar16 != local_160) {
        this_00 = &local_180->_mapping;
        do {
          pFVar18 = pFVar16 + -0x18;
          if (pFVar16 == (Function *)0x0) {
            pFVar18 = (Function *)0x0;
          }
          iVar5 = predecessorsNumber((BasicBlock *)pFVar18);
          if (iVar5 < 1) {
            bVar4 = pFVar16 == (Function *)0x0;
            if (*(long *)(*(long *)((BasicBlock *)pFVar18 + 0x38) + 0x50) != 0) {
              bVar4 = (BasicBlock *)
                      (*(long *)(*(long *)((BasicBlock *)pFVar18 + 0x38) + 0x50) + -0x18) ==
                      (BasicBlock *)pFVar18;
            }
            if (bVar4) goto LAB_00129539;
          }
          else {
LAB_00129539:
            local_18a = true;
            local_158 = pFVar16;
            for (pBVar17 = *(BasicBlock **)((BasicBlock *)pFVar18 + 0x30); pFVar16 = local_158,
                pBVar17 != (BasicBlock *)pFVar18 + 0x28; pBVar17 = *(BasicBlock **)(pBVar17 + 8)) {
              pBVar8 = (Block *)(pBVar17 + -0x18);
              if (pBVar17 == (BasicBlock *)0x0) {
                pBVar8 = (Block *)0x0;
              }
              if (local_18a == true) {
                pBVar9 = (Block *)operator_new(0x118);
                Block::Block(pBVar9,(BasicBlock *)pFVar18,false);
                local_150._0_8_ = pBVar9;
                local_90._M_impl._0_8_ = pFVar18;
                pvVar10 = (vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                           *)std::__detail::
                             _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)this_00,(key_type *)&local_90);
                iVar2._M_current = *(Block ***)(pvVar10 + 8);
                if (iVar2._M_current == *(Block ***)(pvVar10 + 0x10)) {
                  std::vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                  ::_M_realloc_insert<dg::llvmdg::legacy::Block*const&>
                            (pvVar10,iVar2,(Block **)local_150);
                }
                else {
                  *iVar2._M_current = (Block *)local_150._0_8_;
                  *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
                }
                Function::addBlock(local_178,(Block *)local_150._0_8_);
                if ((local_188 != (Block *)0x0) && (local_188->_llvm_blk == (BasicBlock *)pFVar18))
                {
                  Block::addSuccessor(local_188,(Block *)local_150._0_8_);
                }
                local_188 = (Block *)local_150._0_8_;
                local_18a = false;
              }
              local_189 = false;
              if (((char)local_170 != '\0') &&
                 (*(char *)&(((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                               *)&(pBVar8->llvmInstructions_).
                                  super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_t)._M_impl == 'S')
                 ) {
                handleCallInstruction
                          (local_180,(Instruction *)pBVar8,local_188,&local_18a,&local_189);
              }
              Block::addInstruction(local_188,(Instruction *)pBVar8);
              local_150._0_8_ = pBVar8;
              std::
              _Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
              ::_M_emplace_unique<llvm::Instruction_const*,dg::llvmdg::legacy::Block*&>
                        ((_Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
                          *)&local_60,(Instruction **)local_150,&local_188);
              if (local_189 == true) {
                pBVar8 = (Block *)operator_new(0x118);
                Block::Block(pBVar8,(BasicBlock *)pFVar18,true);
                local_150._0_8_ = pBVar8;
                local_90._M_impl._0_8_ = pFVar18;
                pvVar10 = (vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                           *)std::__detail::
                             _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)this_00,(key_type *)&local_90);
                iVar2._M_current = *(Block ***)(pvVar10 + 8);
                if (iVar2._M_current == *(Block ***)(pvVar10 + 0x10)) {
                  std::vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                  ::_M_realloc_insert<dg::llvmdg::legacy::Block*const&>
                            (pvVar10,iVar2,(Block **)local_150);
                }
                else {
                  *iVar2._M_current = (Block *)local_150._0_8_;
                  *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
                }
                Function::addBlock(local_178,(Block *)local_150._0_8_);
                Block::addSuccessor(local_188,(Block *)local_150._0_8_);
                local_188 = (Block *)local_150._0_8_;
                local_18a = true;
              }
            }
          }
          pFVar16 = *(Function **)(pFVar16 + 8);
        } while (pFVar16 != local_160);
      }
      pFVar16 = *(Function **)(local_168 + 0x50);
      local_180 = (GraphBuilder *)(local_168 + 0x48);
      if ((GraphBuilder *)pFVar16 != local_180) {
        do {
          pFVar18 = pFVar16 + -0x18;
          if (pFVar16 == (Function *)0x0) {
            pFVar18 = (Function *)0x0;
          }
          iVar5 = predecessorsNumber((BasicBlock *)pFVar18);
          if (iVar5 < 1) {
            bVar4 = pFVar16 == (Function *)0x0;
            if (*(long *)(*(long *)((BasicBlock *)pFVar18 + 0x38) + 0x50) != 0) {
              bVar4 = (BasicBlock *)
                      (*(long *)(*(long *)((BasicBlock *)pFVar18 + 0x38) + 0x50) + -0x18) ==
                      (BasicBlock *)pFVar18;
            }
            if (bVar4) goto LAB_00129777;
          }
          else {
LAB_00129777:
            local_150._0_8_ = *(long *)((BasicBlock *)pFVar18 + 0x28) + -0x18;
            if (*(long *)((BasicBlock *)pFVar18 + 0x28) == 0) {
              local_150._0_8_ = (Block *)0x0;
            }
            pBVar9 = (Block *)local_150;
            local_170 = pFVar16;
            ppBVar11 = std::
                       map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                       ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                     *)&local_60,(key_type *)local_150);
            pBVar8 = *ppBVar11;
            uVar6 = llvm::BasicBlock::getTerminator();
            iVar5 = 0;
            while( true ) {
              __status = (int)pBVar9;
              lVar12 = llvm::BasicBlock::getTerminator();
              iVar7 = 0;
              if (lVar12 != 0) {
                iVar7 = llvm::Instruction::getNumSuccessors();
              }
              if (iVar5 == iVar7) break;
              lVar12 = llvm::Instruction::getSuccessor(uVar6);
              local_150._0_8_ = *(long *)(lVar12 + 0x30) + -0x18;
              if (*(long *)(lVar12 + 0x30) == 0) {
                local_150._0_8_ = (Block *)0x0;
              }
              ppBVar11 = std::
                         map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                         ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                       *)&local_60,(key_type *)local_150);
              pBVar9 = *ppBVar11;
              Block::addSuccessor(pBVar8,pBVar9);
              iVar5 = iVar5 + 1;
            }
            lVar12 = llvm::BasicBlock::getTerminator();
            pFVar16 = local_170;
            if ((lVar12 == 0) || (iVar5 = llvm::Instruction::getNumSuccessors(), iVar5 == 0)) {
              Function::exit(local_178,__status);
              Block::addSuccessor(pBVar8,successor);
            }
          }
          pFVar16 = *(Function **)(pFVar16 + 8);
        } while ((GraphBuilder *)pFVar16 != local_180);
      }
      this_01 = local_178;
      Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                       *)&local_90,local_178);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::TarjanAnalysis
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150,
                 local_90._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
      pBVar8 = Function::entry(this_01);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::compute
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150,pBVar8);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::computeCondensation
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150);
      for (p_Var13 = (_Rb_tree_node_base *)local_150._168_8_;
          p_Var13 != (_Rb_tree_node_base *)(local_150 + 0x98);
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        lVar12 = *(long *)(p_Var13 + 1);
        if (((*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8) != 8) ||
            (lVar3 = *(long *)(*(long *)(lVar12 + 0x10) + -8), Function::exit(this_01,(int)pBVar8),
            lVar3 != extraout_RAX)) && (*(long *)(lVar12 + 0x48) == 0)) {
          pBVar9 = *(Block **)(*(long *)(lVar12 + 0x10) + -8);
          Function::exit(this_01,(int)pBVar8);
          pBVar8 = successor_00;
          Block::addSuccessor(pBVar9,successor_00);
        }
      }
      TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
                ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150);
      std::
      _Rb_tree<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>,_std::_Select1st<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
      return this_01;
    }
  }
  return (Function *)0x0;
}

Assistant:

Function *GraphBuilder::buildFunction(const llvm::Function *llvmFunction,
                                      bool recursively) {
    if (!llvmFunction) {
        return nullptr;
    }
    auto iterator = _functions.find(llvmFunction);
    if (iterator != _functions.end()) {
        return nullptr;
    }
    iterator = _functions.emplace(llvmFunction, new Function()).first;
    Function *function = iterator->second;

    std::map<const llvm::Instruction *, Block *> instToBlockMap;
    Block *lastBlock = nullptr;
    for (const auto &llvmBlock : *llvmFunction) {
        if (!isReachable(&llvmBlock)) {
            continue;
        }

        bool createBlock = true;
        for (const auto &llvmInst : llvmBlock) {
            if (createBlock) {
                auto *tmpBlock = new Block(&llvmBlock);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                if (lastBlock) {
                    if (lastBlock->llvmBlock() == &llvmBlock) {
                        lastBlock->addSuccessor(tmpBlock);
                    }
                }
                lastBlock = tmpBlock;
                createBlock = false;
            }
            bool createCallReturn = false;
            if (recursively &&
                llvmInst.getOpcode() == llvm::Instruction::Call) {
                handleCallInstruction(&llvmInst, lastBlock, createBlock,
                                      createCallReturn);
            }
            lastBlock->addInstruction(&llvmInst);
            instToBlockMap.emplace(&llvmInst, lastBlock);

            if (createCallReturn) {
                auto *tmpBlock = new Block(&llvmBlock, createCallReturn);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                lastBlock->addSuccessor(tmpBlock);
                lastBlock = tmpBlock;
                createBlock = true;
            }
        }
    }

    for (const auto &llvmBlock : *llvmFunction) {
        if (isReachable(&llvmBlock)) {
            auto *block = instToBlockMap[&llvmBlock.back()];
            for (auto succ = llvm::succ_begin(&llvmBlock);
                 succ != llvm::succ_end(&llvmBlock); ++succ) {
                auto *succ_block = instToBlockMap[&succ->front()];
                block->addSuccessor(succ_block);
            }
            if (successorsNumber(&llvmBlock) == 0) {
                block->addSuccessor(function->exit());
            }
        }
    }

    TarjanAnalysis<Block> tarjan(function->nodes().size());
    tarjan.compute(function->entry());
    tarjan.computeCondensation();
    const auto &componentss = tarjan.components();
    for (auto *const component : componentss) {
        if (!isExit(component, function) && component->successors().empty()) {
            component->nodes().back()->addSuccessor(function->exit());
        }
    }

    //    auto components =
    //    tarjan.computeBackWardReachability(function->exit());

    //    for (auto component : components) {
    //        if (component->nodes().size() > 1 ||
    //            component->successors().find(component) !=
    //            component->successors().end()) {
    //            component->nodes().back()->addSuccessor(function->exit());
    //        }
    //    }

    return function;
}